

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_set.c
# Opt level: O2

set set_create(set_cb_hash hash_cb,set_cb_compare compare_cb)

{
  set __ptr;
  size_t size;
  bucket pbVar1;
  char *pcVar2;
  undefined8 uStack_20;
  
  if (hash_cb == (set_cb_hash)0x0 || compare_cb == (set_cb_compare)0x0) {
    pcVar2 = "Invalid set creation parameters";
    uStack_20 = 0x4c;
  }
  else {
    __ptr = (set)malloc(0x30);
    if (__ptr != (set)0x0) {
      __ptr->hash_cb = hash_cb;
      __ptr->compare_cb = compare_cb;
      __ptr->count = 0;
      __ptr->prime = 0;
      size = bucket_capacity(0);
      __ptr->capacity = size;
      pbVar1 = bucket_create(size);
      __ptr->buckets = pbVar1;
      if (pbVar1 != (bucket)0x0) {
        return __ptr;
      }
      log_write_impl_va("metacall",0x61,"set_create",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_set.c"
                        ,3,"Bad set bucket creation");
      free(__ptr);
      return (set)0x0;
    }
    pcVar2 = "Bad set allocation";
    uStack_20 = 0x54;
  }
  log_write_impl_va("metacall",uStack_20,"set_create",
                    "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_set.c"
                    ,3,pcVar2);
  return (set)0x0;
}

Assistant:

set set_create(set_cb_hash hash_cb, set_cb_compare compare_cb)
{
	set s;

	if (hash_cb == NULL || compare_cb == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid set creation parameters");
		return NULL;
	}

	s = malloc(sizeof(struct set_type));

	if (s == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Bad set allocation");
		return NULL;
	}

	s->hash_cb = hash_cb;
	s->compare_cb = compare_cb;
	s->count = 0;
	s->prime = 0;
	s->capacity = bucket_capacity(s->prime);
	s->buckets = bucket_create(s->capacity);

	if (s->buckets == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Bad set bucket creation");
		free(s);
		return NULL;
	}

	return s;
}